

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_recv_op.hpp
# Opt level: O3

status webfront::http::std::experimental::net::v1::detail::
       reactive_socket_recv_op_base<std::experimental::net::v1::mutable_buffer>::do_perform
                 (reactor_op *base)

{
  int __fd;
  int __flags;
  int iVar1;
  scheduler_operation *psVar2;
  status sVar3;
  int *piVar4;
  size_t sVar5;
  error_category *peVar6;
  buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,_std::experimental::net::v1::mutable_buffer>
  bufs;
  msghdr local_88;
  iovec local_48;
  size_t local_38;
  
  local_48.iov_base = base[1].super_operation.func_;
  local_48.iov_len = *(size_t *)&base[1].super_operation.task_result_;
  __fd = *(int *)&base[1].super_operation.next_;
  __flags = base[1].ec_._M_value;
  psVar2 = base[1].super_operation.next_;
  local_38 = local_48.iov_len;
  piVar4 = __errno_location();
  do {
    *piVar4 = 0;
    local_88.msg_control = (void *)0x0;
    local_88.msg_controllen = 0;
    local_88.msg_name = (void *)0x0;
    local_88.msg_namelen = 0;
    local_88._12_4_ = 0;
    local_88.msg_flags = 0;
    local_88._52_4_ = 0;
    local_88.msg_iov = &local_48;
    local_88.msg_iovlen = 1;
    sVar5 = recvmsg(__fd,&local_88,__flags);
    iVar1 = *piVar4;
    peVar6 = (error_category *)::std::_V2::system_category();
    (base->ec_)._M_value = iVar1;
    (base->ec_)._M_cat = peVar6;
    if (-1 < (long)sVar5) {
      (base->ec_)._M_value = 0;
      if (sVar5 == 0 && ((ulong)psVar2 & 0x1000000000) != 0) {
        ::std::error_code::operator=(&base->ec_,eof);
        goto LAB_001177e9;
      }
      (base->ec_)._M_value = 0;
      (base->ec_)._M_cat = peVar6;
      goto LAB_001177e5;
    }
  } while (iVar1 == 4);
  if (iVar1 == 0xb) {
    sVar3 = not_done;
  }
  else {
    sVar5 = 0;
LAB_001177e5:
    base->bytes_transferred_ = sVar5;
LAB_001177e9:
    sVar3 = done;
    if (((ulong)base[1].super_operation.next_ & 0x1000000000) != 0) {
      sVar3 = (base->bytes_transferred_ == 0) + done;
    }
  }
  return sVar3;
}

Assistant:

static status do_perform(reactor_op* base)
  {
    reactive_socket_recv_op_base* o(
        static_cast<reactive_socket_recv_op_base*>(base));

    buffer_sequence_adapter<std::experimental::net::v1::mutable_buffer,
        MutableBufferSequence> bufs(o->buffers_);

    status result = socket_ops::non_blocking_recv(o->socket_,
        bufs.buffers(), bufs.count(), o->flags_,
        (o->state_ & socket_ops::stream_oriented) != 0,
        o->ec_, o->bytes_transferred_) ? done : not_done;

    if (result == done)
      if ((o->state_ & socket_ops::stream_oriented) != 0)
        if (o->bytes_transferred_ == 0)
          result = done_and_exhausted;

    NET_TS_HANDLER_REACTOR_OPERATION((*o, "non_blocking_recv",
          o->ec_, o->bytes_transferred_));

    return result;
  }